

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

ssize_t __thiscall
boost::deflate::deflate_stream_test::ZlibCompressor::write
          (ZlibCompressor *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int res;
  source_location local_50;
  invalid_argument local_38 [16];
  int local_28;
  int local_24;
  int zlib_flush;
  Flush flush_local;
  ZlibCompressor *this_local;
  
  local_28 = write::zlib_flushes[__fd];
  local_24 = __fd;
  _zlib_flush = this;
  if (((this->zs).next_in == (Bytef *)0x0) && ((this->zs).avail_in != 0)) {
    std::invalid_argument::invalid_argument(local_38,"zlib compressor: invalid input");
    source_location::source_location
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
               ,0x5e,
               "virtual error_code boost::deflate::deflate_stream_test::ZlibCompressor::write(Flush)"
               ,0);
    throw_exception<std::invalid_argument>(local_38,&local_50);
  }
  iVar1 = ::deflate(&this->zs,local_28);
  switch(iVar1) {
  case 0:
    system::error_code::error_code((error_code *)&this_local);
    break;
  case 1:
    system::error_code::error_code<boost::deflate::error>
              ((error_code *)&this_local,end_of_stream,(type *)0x0);
    break;
  case -5:
    system::error_code::error_code<boost::deflate::error>
              ((error_code *)&this_local,need_buffers,(type *)0x0);
    break;
  default:
    __cxa_rethrow();
    break;
  case -2:
    system::error_code::error_code<boost::deflate::error>
              ((error_code *)&this_local,stream_error,(type *)0x0);
  }
  return (ssize_t)this_local;
}

Assistant:

error_code write(Flush flush) override {
            constexpr static int zlib_flushes[] = {0, Z_BLOCK, Z_PARTIAL_FLUSH, Z_SYNC_FLUSH, Z_FULL_FLUSH, Z_FINISH, Z_TREES};
            const auto zlib_flush = zlib_flushes[static_cast<int>(flush)];
            if(zs.next_in == nullptr && zs.avail_in != 0)
              BOOST_THROW_EXCEPTION(std::invalid_argument{"zlib compressor: invalid input"});
            const auto res = ::deflate(&zs, zlib_flush);
            switch(res){
            case Z_OK:
                return {};
            case Z_STREAM_END:
                return error::end_of_stream;
            case Z_STREAM_ERROR:
                return error::stream_error;
            case Z_BUF_ERROR:
                return error::need_buffers;
            default:
                throw;
            }
        }